

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitLocalSet
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,LocalSet *curr)

{
  bool bVar1;
  byte bVar2;
  ExpressionRunner<wasm::ModuleRunner> *this_00;
  Type TVar3;
  reference this_01;
  byte local_ca;
  undefined1 local_70 [8];
  Flow flow;
  Index index;
  LocalSet *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str._4_4_ = *(uint *)(curr + 0x10);
  this_00 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_70,this_00,*(Expression **)(curr + 0x18));
  bVar1 = Flow::breaking((Flow *)local_70);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_70);
  }
  else {
    bVar2 = ::wasm::LocalSet::isTee();
    if ((bVar2 & 1) == 0) {
      local_ca = 1;
    }
    else {
      TVar3 = Flow::getType((Flow *)local_70);
      local_ca = ::wasm::Type::isSubType(TVar3,(Type)*(uintptr_t *)(curr + 8));
    }
    if ((local_ca & 1) == 0) {
      __assert_fail("curr->isTee() ? Type::isSubType(flow.getType(), curr->type) : true",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0xdfa,
                    "Flow wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitLocalSet(LocalSet *) [SubType = wasm::ModuleRunner]"
                   );
    }
    this_01 = std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::operator[]
                        (&this->scope->locals,(ulong)flow.breakTo.super_IString.str._M_str._4_4_);
    Literals::operator=(this_01,(Literals *)local_70);
    bVar2 = ::wasm::LocalSet::isTee();
    if ((bVar2 & 1) == 0) {
      Flow::Flow(__return_storage_ptr__);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_70);
    }
  }
  Flow::~Flow((Flow *)local_70);
  return __return_storage_ptr__;
}

Assistant:

Flow visitLocalSet(LocalSet* curr) {
    NOTE_ENTER("LocalSet");
    auto index = curr->index;
    Flow flow = self()->visit(curr->value);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(index);
    NOTE_EVAL1(flow.getSingleValue());
    assert(curr->isTee() ? Type::isSubType(flow.getType(), curr->type) : true);
    scope->locals[index] = flow.values;
    return curr->isTee() ? flow : Flow();
  }